

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.cpp
# Opt level: O0

mz_bool duckdb_miniz::mz_zip_writer_update_zip64_extension_block
                  (mz_zip_array *pNew_ext,mz_zip_archive *pZip,mz_uint8 *pExt,uint32_t ext_len,
                  mz_uint64 *pComp_size,mz_uint64 *pUncomp_size,mz_uint64 *pLocal_header_ofs,
                  mz_uint32 *pDisk_start)

{
  undefined4 uVar1;
  undefined8 uVar2;
  long lVar3;
  bool bVar4;
  mz_bool mVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  uint in_ECX;
  short *in_RDX;
  long in_RSI;
  long *in_RDI;
  undefined8 *in_R8;
  undefined8 *in_R9;
  undefined8 *in_stack_00000008;
  mz_uint32 field_total_size;
  mz_uint32 field_data_size;
  mz_uint32 field_id;
  mz_uint8 *pExtra_data;
  mz_uint32 extra_size_remaining;
  mz_uint8 *pDst;
  mz_uint8 new_ext_block [64];
  size_t orig_size_1;
  size_t orig_size;
  undefined8 in_stack_fffffffffffffd70;
  mz_uint growing;
  undefined4 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd7c;
  mz_zip_array *in_stack_fffffffffffffd80;
  undefined1 uVar9;
  short sVar10;
  mz_zip_archive *in_stack_fffffffffffffd88;
  undefined1 local_270 [4];
  mz_zip_array local_26c [3];
  mz_bool local_200;
  
  growing = (mz_uint)((ulong)in_stack_fffffffffffffd70 >> 0x20);
  if (((ulong)in_RDI[2] < (ulong)(in_ECX + 0x40)) &&
     (mVar5 = mz_zip_array_ensure_capacity
                        (in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
                         CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),growing),
     mVar5 == 0)) {
    bVar4 = false;
  }
  else {
    bVar4 = true;
  }
  if (bVar4) {
    in_RDI[1] = 0;
    if ((((in_R9 != (undefined8 *)0x0) || (in_R8 != (undefined8 *)0x0)) ||
        (in_stack_00000008 != (undefined8 *)0x0)) || (_field_data_size != (undefined4 *)0x0)) {
      uVar9 = 1;
      uVar9 = 0;
      uVar9 = 0;
      uVar9 = 0;
      in_stack_fffffffffffffd80 = (mz_zip_array *)&stack0xfffffffffffffd8c;
      if (in_R9 != (undefined8 *)0x0) {
        uVar2 = *in_R9;
        uVar9 = (char)uVar2;
        uVar9 = (char)((ulong)uVar2 >> 8);
        uVar9 = (char)((ulong)uVar2 >> 0x10);
        uVar9 = (char)((ulong)uVar2 >> 0x18);
        in_stack_fffffffffffffd80 = (mz_zip_array *)(local_270 + 4);
      }
      if (in_R8 != (undefined8 *)0x0) {
        uVar2 = *in_R8;
        *(char *)&in_stack_fffffffffffffd80->m_p = (char)uVar2;
        *(char *)((long)&in_stack_fffffffffffffd80->m_p + 1) = (char)((ulong)uVar2 >> 8);
        *(char *)((long)&in_stack_fffffffffffffd80->m_p + 2) = (char)((ulong)uVar2 >> 0x10);
        *(char *)((long)&in_stack_fffffffffffffd80->m_p + 3) = (char)((ulong)uVar2 >> 0x18);
        *(char *)((long)&in_stack_fffffffffffffd80->m_p + 4) = (char)((ulong)uVar2 >> 0x20);
        *(char *)((long)&in_stack_fffffffffffffd80->m_p + 5) = (char)((ulong)uVar2 >> 0x28);
        *(char *)((long)&in_stack_fffffffffffffd80->m_p + 6) = (char)((ulong)uVar2 >> 0x30);
        *(char *)((long)&in_stack_fffffffffffffd80->m_p + 7) = (char)((ulong)uVar2 >> 0x38);
        in_stack_fffffffffffffd80 = (mz_zip_array *)&in_stack_fffffffffffffd80->m_size;
      }
      if (in_stack_00000008 != (undefined8 *)0x0) {
        uVar2 = *in_stack_00000008;
        *(char *)&in_stack_fffffffffffffd80->m_p = (char)uVar2;
        *(char *)((long)&in_stack_fffffffffffffd80->m_p + 1) = (char)((ulong)uVar2 >> 8);
        *(char *)((long)&in_stack_fffffffffffffd80->m_p + 2) = (char)((ulong)uVar2 >> 0x10);
        *(char *)((long)&in_stack_fffffffffffffd80->m_p + 3) = (char)((ulong)uVar2 >> 0x18);
        *(char *)((long)&in_stack_fffffffffffffd80->m_p + 4) = (char)((ulong)uVar2 >> 0x20);
        *(char *)((long)&in_stack_fffffffffffffd80->m_p + 5) = (char)((ulong)uVar2 >> 0x28);
        *(char *)((long)&in_stack_fffffffffffffd80->m_p + 6) = (char)((ulong)uVar2 >> 0x30);
        *(char *)((long)&in_stack_fffffffffffffd80->m_p + 7) = (char)((ulong)uVar2 >> 0x38);
        in_stack_fffffffffffffd80 = (mz_zip_array *)&in_stack_fffffffffffffd80->m_size;
      }
      if (_field_data_size != (undefined4 *)0x0) {
        uVar1 = *_field_data_size;
        *(char *)&in_stack_fffffffffffffd80->m_p = (char)uVar1;
        *(char *)((long)&in_stack_fffffffffffffd80->m_p + 1) = (char)((uint)uVar1 >> 8);
        *(char *)((long)&in_stack_fffffffffffffd80->m_p + 2) = (char)((uint)uVar1 >> 0x10);
        *(char *)((long)&in_stack_fffffffffffffd80->m_p + 3) = (char)((uint)uVar1 >> 0x18);
        in_stack_fffffffffffffd80 = (mz_zip_array *)((long)&in_stack_fffffffffffffd80->m_p + 4);
      }
      sVar10 = ((short)in_stack_fffffffffffffd80 - (short)&stack0xfffffffffffffd88) + -4;
      lVar7 = (long)in_stack_fffffffffffffd80 - (long)&stack0xfffffffffffffd88;
      lVar3 = in_RDI[1];
      uVar8 = lVar3 + lVar7;
      if (((ulong)in_RDI[2] < uVar8) &&
         (mVar5 = mz_zip_array_ensure_capacity
                            (in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
                             CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),growing),
         mVar5 == 0)) {
        bVar4 = false;
      }
      else {
        in_RDI[1] = uVar8;
        bVar4 = true;
      }
      if (!bVar4) {
        if (in_RSI != 0) {
          *(undefined4 *)(in_RSI + 0x1c) = 0x10;
        }
        return 0;
      }
      memcpy((void *)(*in_RDI + lVar3 * (ulong)*(uint *)(in_RDI + 3)),&stack0xfffffffffffffd88,
             lVar7 * (ulong)*(uint *)(in_RDI + 3));
    }
    if ((in_RDX != (short *)0x0) && (in_ECX != 0)) {
      do {
        if (in_ECX < 4) {
          if (in_RSI != 0) {
            *(undefined4 *)(in_RSI + 0x1c) = 9;
          }
          return 0;
        }
        uVar6 = (ushort)in_RDX[1] + 4;
        if (in_ECX < uVar6) {
          if (in_RSI != 0) {
            *(undefined4 *)(in_RSI + 0x1c) = 9;
          }
          return 0;
        }
        if (*in_RDX != 1) {
          lVar3 = in_RDI[1];
          uVar8 = lVar3 + (ulong)uVar6;
          if (((ulong)in_RDI[2] < uVar8) &&
             (mVar5 = mz_zip_array_ensure_capacity
                                (in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
                                 CONCAT44(in_ECX,in_stack_fffffffffffffd78),
                                 (mz_uint)((ulong)in_RDX >> 0x20)), mVar5 == 0)) {
            bVar4 = false;
          }
          else {
            in_RDI[1] = uVar8;
            bVar4 = true;
          }
          if (!bVar4) {
            if (in_RSI != 0) {
              *(undefined4 *)(in_RSI + 0x1c) = 0x10;
            }
            return 0;
          }
          memcpy((void *)(*in_RDI + lVar3 * (ulong)*(uint *)(in_RDI + 3)),in_RDX,
                 (ulong)uVar6 * (ulong)*(uint *)(in_RDI + 3));
        }
        in_RDX = (short *)((long)in_RDX + (ulong)uVar6);
        in_ECX = in_ECX - uVar6;
      } while (in_ECX != 0);
    }
    local_200 = 1;
  }
  else {
    if (in_RSI != 0) {
      *(undefined4 *)(in_RSI + 0x1c) = 0x10;
    }
    local_200 = 0;
  }
  return local_200;
}

Assistant:

static mz_bool mz_zip_writer_update_zip64_extension_block(mz_zip_array *pNew_ext, mz_zip_archive *pZip, const mz_uint8 *pExt, uint32_t ext_len, mz_uint64 *pComp_size, mz_uint64 *pUncomp_size, mz_uint64 *pLocal_header_ofs, mz_uint32 *pDisk_start)
{
    /* + 64 should be enough for any new zip64 data */
    if (!mz_zip_array_reserve(pZip, pNew_ext, ext_len + 64, MZ_FALSE))
        return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

    mz_zip_array_resize(pZip, pNew_ext, 0, MZ_FALSE);

    if ((pUncomp_size) || (pComp_size) || (pLocal_header_ofs) || (pDisk_start))
    {
        mz_uint8 new_ext_block[64];
        mz_uint8 *pDst = new_ext_block;
        mz_write_le16(pDst, MZ_ZIP64_EXTENDED_INFORMATION_FIELD_HEADER_ID);
        mz_write_le16(pDst + sizeof(mz_uint16), 0);
        pDst += sizeof(mz_uint16) * 2;

        if (pUncomp_size)
        {
            mz_write_le64(pDst, *pUncomp_size);
            pDst += sizeof(mz_uint64);
        }

        if (pComp_size)
        {
            mz_write_le64(pDst, *pComp_size);
            pDst += sizeof(mz_uint64);
        }

        if (pLocal_header_ofs)
        {
            mz_write_le64(pDst, *pLocal_header_ofs);
            pDst += sizeof(mz_uint64);
        }

        if (pDisk_start)
        {
            mz_write_le32(pDst, *pDisk_start);
            pDst += sizeof(mz_uint32);
        }

        mz_write_le16(new_ext_block + sizeof(mz_uint16), (mz_uint16)((pDst - new_ext_block) - sizeof(mz_uint16) * 2));

        if (!mz_zip_array_push_back(pZip, pNew_ext, new_ext_block, pDst - new_ext_block))
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
    }

    if ((pExt) && (ext_len))
    {
        mz_uint32 extra_size_remaining = ext_len;
        const mz_uint8 *pExtra_data = pExt;

        do
        {
            mz_uint32 field_id, field_data_size, field_total_size;

            if (extra_size_remaining < (sizeof(mz_uint16) * 2))
                return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

            field_id = MZ_READ_LE16(pExtra_data);
            field_data_size = MZ_READ_LE16(pExtra_data + sizeof(mz_uint16));
            field_total_size = field_data_size + sizeof(mz_uint16) * 2;

            if (field_total_size > extra_size_remaining)
                return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

            if (field_id != MZ_ZIP64_EXTENDED_INFORMATION_FIELD_HEADER_ID)
            {
                if (!mz_zip_array_push_back(pZip, pNew_ext, pExtra_data, field_total_size))
                    return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
            }

            pExtra_data += field_total_size;
            extra_size_remaining -= field_total_size;
        } while (extra_size_remaining);
    }

    return MZ_TRUE;
}